

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device_api.h
# Opt level: O0

char * tvm::runtime::DeviceName(int type)

{
  ostringstream *poVar1;
  ostream *this;
  LogMessageFatal local_1a0;
  int local_14;
  char *pcStack_10;
  int type_local;
  
  switch(type) {
  case 1:
    pcStack_10 = "cpu";
    break;
  case 2:
    pcStack_10 = "gpu";
    break;
  default:
    local_14 = type;
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/include/tvm/runtime/device_api.h"
               ,0xe6);
    poVar1 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_1a0);
    this = std::operator<<((ostream *)poVar1,"unknown type =");
    std::ostream::operator<<(this,local_14);
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1a0);
    pcStack_10 = "Unknown";
    break;
  case 4:
    pcStack_10 = "opencl";
    break;
  case 5:
    pcStack_10 = "aocl";
    break;
  case 6:
    pcStack_10 = "sdaccel";
    break;
  case 7:
    pcStack_10 = "vulkan";
    break;
  case 8:
    pcStack_10 = "metal";
    break;
  case 9:
    pcStack_10 = "vpi";
    break;
  case 10:
    pcStack_10 = "rocm";
    break;
  case 0xb:
    pcStack_10 = "opengl";
    break;
  case 0xc:
    pcStack_10 = "ext_dev";
  }
  return pcStack_10;
}

Assistant:

inline const char *DeviceName(int type) {
  switch (type) {
  case kDLCPU:
    return "cpu";
  case kDLGPU:
    return "gpu";
  case kDLOpenCL:
    return "opencl";
  case kDLSDAccel:
    return "sdaccel";
  case kDLAOCL:
    return "aocl";
  case kDLVulkan:
    return "vulkan";
  case kDLMetal:
    return "metal";
  case kDLVPI:
    return "vpi";
  case kDLROCM:
    return "rocm";
  case kOpenGL:
    return "opengl";
  case kDLExtDev:
    return "ext_dev";
  default:
    LOG(FATAL) << "unknown type =" << type;
    return "Unknown";
  }
}